

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int coda_inflatePrime(z_streamp strm,int bits,int value)

{
  uint uVar1;
  internal_state *piVar2;
  int iVar3;
  
  iVar3 = inflateStateCheck(strm);
  if (iVar3 != 0) {
    return -2;
  }
  if (bits != 0) {
    piVar2 = strm->state;
    if (bits < 0) {
      *(undefined8 *)(piVar2 + 0x50) = 0;
      *(undefined4 *)(piVar2 + 0x58) = 0;
    }
    else {
      if (0x10 < (uint)bits) {
        return -2;
      }
      uVar1 = *(int *)(piVar2 + 0x58) + bits;
      if (0x20 < uVar1) {
        return -2;
      }
      *(ulong *)(piVar2 + 0x50) =
           *(long *)(piVar2 + 0x50) +
           (ulong)((~(uint)(-1L << ((byte)bits & 0x3f)) & value) <<
                  ((byte)*(int *)(piVar2 + 0x58) & 0x1f));
      *(uint *)(piVar2 + 0x58) = uVar1;
    }
  }
  return 0;
}

Assistant:

int ZEXPORT inflatePrime(z_streamp strm, int bits, int value) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    if (bits == 0)
        return Z_OK;
    state = (struct inflate_state FAR *)strm->state;
    if (bits < 0) {
        state->hold = 0;
        state->bits = 0;
        return Z_OK;
    }
    if (bits > 16 || state->bits + (uInt)bits > 32) return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += (unsigned)value << state->bits;
    state->bits += (uInt)bits;
    return Z_OK;
}